

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_debug.cpp
# Opt level: O2

spv_result_t spvtools::val::DebugPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  uint uVar2;
  Instruction *pIVar3;
  char *pcVar4;
  string local_240;
  string local_220;
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 8) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar3 = ValidationState_t::FindDef(_,uVar2);
    if ((pIVar3 != (Instruction *)0x0) && ((pIVar3->inst_).opcode == 7)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&local_200,"OpLine Target <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar2);
    std::operator<<((ostream *)&local_200,(string *)&local_240);
    pcVar4 = " is not an OpString.";
  }
  else {
    if (uVar1 != 6) {
      return SPV_SUCCESS;
    }
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar3 = ValidationState_t::FindDef(_,uVar2);
    if ((pIVar3 != (Instruction *)0x0) && ((pIVar3->inst_).opcode == 0x1e)) {
      uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      if (uVar2 < (int)((ulong)((long)(pIVar3->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pIVar3->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) - 2U) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_200,"OpMemberName Member <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar2);
      std::operator<<((ostream *)&local_200,(string *)&local_240);
      std::operator<<((ostream *)&local_200," index is larger than Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_220,_,(pIVar3->inst_).result_id);
      std::operator<<((ostream *)&local_200,(string *)&local_220);
      std::operator<<((ostream *)&local_200,"s member count.");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      goto LAB_0053e716;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&local_200,"OpMemberName Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar2);
    std::operator<<((ostream *)&local_200,(string *)&local_240);
    pcVar4 = " is not a struct type.";
  }
  std::operator<<((ostream *)&local_200,pcVar4);
  std::__cxx11::string::_M_dispose();
LAB_0053e716:
  DiagnosticStream::~DiagnosticStream(&local_200);
  if (local_200.error_ == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return local_200.error_;
}

Assistant:

spv_result_t DebugPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpMemberName:
      if (auto error = ValidateMemberName(_, inst)) return error;
      break;
    case spv::Op::OpLine:
      if (auto error = ValidateLine(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}